

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall Stack2_advanced_Except_Test::TestBody(Stack2_advanced_Except_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_c0;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  exception *e;
  Stack<Stack<int>_> local_20;
  Stack<Stack<int>_> r;
  bool flag;
  Stack2_advanced_Except_Test *this_local;
  
  r.top._7_1_ = 0;
  Stack<Stack<int>_>::Stack(&local_20);
  Stack<Stack<int>_>::head(&local_20);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_90,(bool *)((long)&r.top + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)local_90,(AssertionResult *)"flag","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_5/tests/test.cpp"
               ,0x8f,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  Stack<Stack<int>_>::~Stack(&local_20);
  return;
}

Assistant:

TEST(Stack2_advanced, Except) {
	bool flag = false;
	Stack<Stack<int>> r;
	try {
		r.head();
	}
	catch (std::exception & e) {
		EXPECT_EQ(std::string(e.what()), "The stack is empty!");
		flag = true;
	}
	EXPECT_TRUE(flag);
}